

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int Data_Entry(FORM *form,int c)

{
  FIELD *field_00;
  _Bool _Var1;
  bool bVar2;
  int local_2c;
  _Bool End_Of_Field;
  _Bool There_Is_Room;
  int result;
  FIELD *field;
  int c_local;
  FORM *form_local;
  
  field_00 = form->current;
  local_2c = -0xc;
  if (((field_00->opts & 8U) != 0) && ((field_00->opts & 2U) != 0)) {
    if ((((field_00->opts & 0x20U) != 0) &&
        (((form->currow == 0 && (form->curcol == 0)) && ((form->status & 0x20) == 0)))) &&
       ((form->status & 0x10) == 0)) {
      werase(form->w);
    }
    if ((form->status & 4) == 0) {
      _Var1 = Is_There_Room_For_A_Char_In_Line(form);
      if ((!_Var1) && (((int)field_00->rows + field_00->nrow != 1 || ((field_00->status & 8) == 0)))
         ) {
        return -0xc;
      }
      if ((!_Var1) && (_Var1 = Field_Grown(field_00,1), !_Var1)) {
        return -1;
      }
      winsch(form->w,c);
    }
    else {
      waddch(form->w,c);
    }
    local_2c = Wrapping_Not_Necessary_Or_Wrapping_Ok(form);
    if (local_2c == 0) {
      bVar2 = false;
      if (field_00->drows + -1 == form->currow) {
        bVar2 = field_00->dcols + -1 == form->curcol;
      }
      form->status = form->status | 0x10;
      if (((bVar2) && ((field_00->status & 8) == 0)) && ((field_00->opts & 0x40U) != 0)) {
        local_2c = Inter_Field_Navigation(FN_Next_Field,form);
      }
      else if (((!bVar2) || ((field_00->status & 8) == 0)) ||
              (_Var1 = Field_Grown(field_00,1), _Var1)) {
        IFN_Next_Character(form);
        local_2c = 0;
      }
      else {
        local_2c = -1;
      }
    }
  }
  return local_2c;
}

Assistant:

static int Data_Entry(FORM * form, int c)
{
  FIELD  *field = form->current;
  int result = E_REQUEST_DENIED;

  if ( (field->opts & O_EDIT) 
#if FIX_FORM_INACTIVE_BUG
       && (field->opts & O_ACTIVE) 
#endif
       )
    {
      if ( (field->opts & O_BLANK) &&
           First_Position_In_Current_Field(form) &&
           !(form->status & _FCHECK_REQUIRED) && 
           !(form->status & _WINDOW_MODIFIED) )
        werase(form->w);

      if (form->status & _OVLMODE)
        {
          waddch(form->w,(chtype)c);
        } 
      else /* no _OVLMODE */ 
        {
          bool There_Is_Room = Is_There_Room_For_A_Char_In_Line(form);

          if (!(There_Is_Room ||
                ((Single_Line_Field(field) && Growable(field)))))
              return E_REQUEST_DENIED;

          if (!There_Is_Room && !Field_Grown(field,1))
            return E_SYSTEM_ERROR;

          winsch(form->w,(chtype)c);
        }

      if ((result=Wrapping_Not_Necessary_Or_Wrapping_Ok(form))==E_OK)
        {
          bool End_Of_Field= (((field->drows-1)==form->currow) &&
                              ((field->dcols-1)==form->curcol));
          form->status |= _WINDOW_MODIFIED;
          if (End_Of_Field && !Growable(field) && (field->opts & O_AUTOSKIP))
            result = Inter_Field_Navigation(FN_Next_Field,form);
          else
            {
              if (End_Of_Field && Growable(field) && !Field_Grown(field,1))
                result = E_SYSTEM_ERROR;
              else
                {
                  IFN_Next_Character(form);
                  result = E_OK;
                }
            }
        }
    }
  return result;
}